

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_25095d::ObjCProtoName::isObjCObject(ObjCProtoName *this)

{
  Node *pNVar1;
  bool bVar2;
  StringView local_28;
  StringView local_10;
  
  pNVar1 = this->Ty;
  if (pNVar1->K == KNameType) {
    local_28.First = (char *)pNVar1[1]._vptr_Node;
    local_28.Last = *(char **)&pNVar1[1].K;
    local_10.First = "objc_object";
    local_10.Last = "";
    bVar2 = operator==(&local_28,&local_10);
    return bVar2;
  }
  return false;
}

Assistant:

bool isObjCObject() const {
    return Ty->getKind() == KNameType &&
           static_cast<NameType *>(Ty)->getName() == "objc_object";
  }